

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

void __thiscall binlog::Session::Session(Session *this)

{
  ClockSync clockSync;
  undefined1 local_60 [64];
  
  (this->_channels).
  super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_channels).
  super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_channels).
  super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
            (&this->_clockSync,0xfe214f726e35bdbc,this);
  detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
            (&this->_sources,0xfe214f726e35bdbc,this);
  this->_sourcesConsumePos = 0;
  this->_nextSourceId = 1;
  this->_totalConsumedBytes = 0;
  (this->_minSeverity)._M_i = trace;
  this->_consumeClockSync = true;
  (this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  systemClockSync();
  serializeSizePrefixedTagged<binlog::ClockSync,binlog::detail::RecoverableVectorOutputStream>
            ((ClockSync *)local_60,&this->_clockSync);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  return;
}

Assistant:

inline Session::Session()
{
  const ClockSync clockSync = systemClockSync();
  serializeSizePrefixedTagged(clockSync, _clockSync);
}